

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaLoader::BuildMeshesForNode
          (ColladaLoader *this,ColladaParser *pParser,Node *pNode,aiNode *pTarget)

{
  pointer *pppaVar1;
  ostream *this_00;
  uint uVar2;
  pointer ppaVar3;
  pointer ppaVar4;
  iterator __position;
  ulong __n;
  pointer puVar5;
  aiMesh *paVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  Logger *pLVar10;
  iterator iVar11;
  iterator iVar12;
  mapped_type_conflict3 *pmVar13;
  uint *puVar14;
  Mesh *pMVar15;
  Controller *pCVar16;
  size_t pSubMesh;
  pointer puVar17;
  pointer __k;
  SemanticMappingTable *table;
  ColladaLoader *pCVar18;
  pointer pSVar19;
  pointer ppVar20;
  long lVar21;
  string meshMaterial;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newMeshRefs;
  aiMesh *dstMesh;
  ColladaMeshIndex index;
  _Rb_tree_color local_2ac;
  key_type local_2a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_288;
  ColladaLoader *local_270;
  size_t local_268;
  aiNode *local_260;
  _Base_ptr local_258;
  MeshLibrary *local_250;
  ColladaParser *local_248;
  size_t local_240;
  map<Assimp::ColladaMeshIndex,_unsigned_long,_std::less<Assimp::ColladaMeshIndex>,_std::allocator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>_>
  *local_238;
  Mesh *local_230;
  SubMesh *local_228;
  aiMesh *local_220 [2];
  undefined1 local_210 [104];
  undefined1 local_1a8 [16];
  aiColor4D local_198;
  aiVector3D *local_180;
  aiVector3D *local_170 [7];
  ios_base local_138 [264];
  
  local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_270 = this;
  local_260 = pTarget;
  local_248 = pParser;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&local_288,
             ((long)(pNode->mMeshes).
                    super__Vector_base<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pNode->mMeshes).
                    super__Vector_base<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333);
  __k = (pNode->mMeshes).
        super__Vector_base<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>
        ._M_impl.super__Vector_impl_data._M_start;
  local_210._32_8_ =
       (pNode->mMeshes).
       super__Vector_base<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__k != (pointer)local_210._32_8_) {
    local_250 = &local_248->mMeshLibrary;
    local_258 = &(local_248->mMeshLibrary)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_210._24_8_ = &local_248->mControllerLibrary;
    local_210._16_8_ = &(local_248->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header;
    local_210._72_8_ = &local_270->mMaterialIndexByName;
    local_210._64_8_ = &(local_270->mMaterialIndexByName)._M_t._M_impl.super__Rb_tree_header;
    local_238 = &local_270->mMeshIndexByID;
    local_210._56_8_ = &(local_270->mMeshIndexByID)._M_t._M_impl.super__Rb_tree_header;
    local_210._40_8_ = &local_270->mMeshes;
    do {
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>_>
              ::find(&local_250->_M_t,&__k->mMeshOrController);
      if (cVar7._M_node == local_258) {
        cVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>_>
                        *)local_210._24_8_,&__k->mMeshOrController);
        if (cVar8._M_node == (_Base_ptr)local_210._16_8_) {
          pCVar16 = (Controller *)0x0;
LAB_00425b9a:
          pMVar15 = (Mesh *)0x0;
        }
        else {
          cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>_>
                  ::find(&local_250->_M_t,(key_type *)&cVar8._M_node[2]._M_parent);
          pCVar16 = (Controller *)(cVar8._M_node + 2);
          if (cVar7._M_node == local_258) goto LAB_00425b9a;
          pMVar15 = *(Mesh **)(cVar7._M_node + 2);
        }
        if (pMVar15 != (Mesh *)0x0) goto LAB_00425ba5;
        pLVar10 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[42]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_210 + 0x68),(char (*) [42])"Collada: Unable to find geometry for ID \"");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_210 + 0x68),(__k->mMeshOrController)._M_dataplus._M_p,
                   (__k->mMeshOrController)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_210 + 0x68),"\". Skipping.",0xc);
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar10,local_2a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,
                          CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                                   local_2a8.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_210 + 0x68));
        std::ios_base::~ios_base(local_138);
      }
      else {
        pMVar15 = *(Mesh **)(cVar7._M_node + 2);
        pCVar16 = (Controller *)0x0;
LAB_00425ba5:
        pSVar19 = (pMVar15->mSubMeshes).
                  super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_210._48_8_ = pCVar16;
        if ((pMVar15->mSubMeshes).
            super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>.
            _M_impl.super__Vector_impl_data._M_finish != pSVar19) {
          local_210._88_8_ = &__k->mMaterials;
          local_210._80_8_ = &(__k->mMaterials)._M_t._M_impl.super__Rb_tree_header;
          lVar21 = 0;
          pSubMesh = 0;
          local_268 = 0;
          local_240 = 0;
          local_230 = pMVar15;
          do {
            if (*(long *)((long)&pSVar19->mNumFaces + lVar21) != 0) {
              local_228 = (SubMesh *)((long)&(pSVar19->mMaterial)._M_dataplus._M_p + lVar21);
              local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
              local_2a8._M_string_length = 0;
              local_2a8.field_2._M_local_buf[0] = '\0';
              cVar9 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>_>
                              *)local_210._88_8_,(key_type *)local_228);
              if (cVar9._M_node == (_Base_ptr)local_210._80_8_) {
                pLVar10 = DefaultLogger::get();
                this_00 = (ostream *)(local_210 + 0x68);
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                basic_formatter<char[46]>
                          ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           this_00,(char (*) [46])"Collada: No material specified for subgroup <");
                std::__ostream_insert<char,std::char_traits<char>>
                          (this_00,*(char **)((long)&(pSVar19->mMaterial)._M_dataplus._M_p + lVar21)
                           ,*(long *)((long)&(pSVar19->mMaterial)._M_string_length + lVar21));
                std::__ostream_insert<char,std::char_traits<char>>(this_00,"> in geometry <",0xf);
                std::__ostream_insert<char,std::char_traits<char>>
                          (this_00,(__k->mMeshOrController)._M_dataplus._M_p,
                           (__k->mMeshOrController)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(this_00,">.",2);
                std::__cxx11::stringbuf::str();
                Logger::warn(pLVar10,(char *)local_220[0]);
                if (local_220[0] != (aiMesh *)local_210) {
                  operator_delete(local_220[0],local_210._0_8_ + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_210 + 0x68));
                std::ios_base::~ios_base(local_138);
                if ((__k->mMaterials)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                  std::__cxx11::string::_M_assign((string *)&local_2a8);
                }
                table = (SemanticMappingTable *)0x0;
              }
              else {
                table = (SemanticMappingTable *)(cVar9._M_node + 2);
                std::__cxx11::string::_M_assign((string *)&local_2a8);
              }
              pCVar18 = (ColladaLoader *)local_210._72_8_;
              iVar11 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                               *)local_210._72_8_,&local_2a8);
              if (iVar11._M_node == (_Base_ptr)local_210._64_8_) {
                local_2ac = _S_red;
              }
              else {
                local_2ac = iVar11._M_node[2]._M_color;
              }
              if ((table != (SemanticMappingTable *)0x0) &&
                 ((table->mMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
                ppVar20 = (local_270->newMats).
                          super__Vector_base<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                ApplyVertexToEffectSemanticMapping
                          (pCVar18,&(ppVar20[local_2ac].first)->mTexDiffuse,table);
                ppVar20 = ppVar20 + local_2ac;
                ApplyVertexToEffectSemanticMapping(pCVar18,&ppVar20->first->mTexAmbient,table);
                ApplyVertexToEffectSemanticMapping(pCVar18,&ppVar20->first->mTexSpecular,table);
                ApplyVertexToEffectSemanticMapping(pCVar18,&ppVar20->first->mTexEmissive,table);
                ApplyVertexToEffectSemanticMapping(pCVar18,&ppVar20->first->mTexTransparent,table);
                ApplyVertexToEffectSemanticMapping(pCVar18,&ppVar20->first->mTexBump,table);
              }
              ColladaMeshIndex::ColladaMeshIndex
                        ((ColladaMeshIndex *)(local_210 + 0x68),&__k->mMeshOrController,pSubMesh,
                         &local_2a8);
              iVar12 = std::
                       _Rb_tree<Assimp::ColladaMeshIndex,_std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>,_std::_Select1st<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>,_std::less<Assimp::ColladaMeshIndex>,_std::allocator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>_>
                       ::find(&local_238->_M_t,(ColladaMeshIndex *)(local_210 + 0x68));
              pCVar18 = local_270;
              if (iVar12._M_node == (_Base_ptr)local_210._56_8_) {
                local_220[0] = CreateMesh(local_270,local_248,local_230,local_228,
                                          (Controller *)local_210._48_8_,local_240,local_268);
                local_210._96_8_ =
                     (long)(pCVar18->mMeshes).
                           super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pCVar18->mMeshes).
                           super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                emplace_back<unsigned_long>(&local_288,(unsigned_long *)(local_210 + 0x60));
                ppaVar3 = (pCVar18->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                ppaVar4 = (pCVar18->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                pmVar13 = std::
                          map<Assimp::ColladaMeshIndex,_unsigned_long,_std::less<Assimp::ColladaMeshIndex>,_std::allocator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>_>
                          ::operator[](local_238,(key_type *)(local_210 + 0x68));
                *pmVar13 = (long)ppaVar4 - (long)ppaVar3 >> 3;
                __position._M_current =
                     (pCVar18->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (pCVar18->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                            ((vector<aiMesh*,std::allocator<aiMesh*>> *)local_210._40_8_,__position,
                             local_220);
                }
                else {
                  *__position._M_current = local_220[0];
                  pppaVar1 = &(pCVar18->mMeshes).
                              super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  *pppaVar1 = *pppaVar1 + 1;
                }
                paVar6 = local_220[0];
                uVar2 = local_220[0]->mNumVertices;
                local_268 = local_268 + local_228->mNumFaces;
                local_220[0]->mMaterialIndex = local_2ac;
                if (((local_220[0]->mName).length == 0) &&
                   (__n = (__k->mMeshOrController)._M_string_length, __n < 0x400)) {
                  (local_220[0]->mName).length = (ai_uint32)__n;
                  memcpy((local_220[0]->mName).data,(__k->mMeshOrController)._M_dataplus._M_p,__n);
                  (paVar6->mName).data[__n] = '\0';
                }
                local_240 = local_240 + uVar2;
              }
              else if (local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish ==
                       local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_288,
                           (iterator)
                           local_288.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish,
                           (unsigned_long *)&iVar12._M_node[3]._M_parent);
              }
              else {
                *local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish = (unsigned_long)iVar12._M_node[3]._M_parent;
                local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              if (local_180 != (aiVector3D *)(local_1a8 + 0x38)) {
                operator_delete(local_180,(ulong)((long)&local_170[0]->x + 1));
              }
              if ((aiColor4D *)local_1a8._0_8_ != (aiColor4D *)(local_1a8 + 0x10)) {
                operator_delete((void *)local_1a8._0_8_,(ulong)((long)(float *)local_198._0_8_ + 1))
                ;
              }
              pMVar15 = local_230;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                operator_delete(local_2a8._M_dataplus._M_p,
                                CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                                         local_2a8.field_2._M_local_buf[0]) + 1);
                pMVar15 = local_230;
              }
            }
            pSubMesh = pSubMesh + 1;
            pSVar19 = (pMVar15->mSubMeshes).
                      super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar21 = lVar21 + 0x28;
          } while (pSubMesh <
                   (ulong)(((long)(pMVar15->mSubMeshes).
                                  super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar19 >> 3) *
                          -0x3333333333333333));
        }
      }
      __k = __k + 1;
    } while (__k != (pointer)local_210._32_8_);
  }
  puVar5 = local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar17 = local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_260->mNumMeshes =
       (uint)((ulong)((long)local_288.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_288.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3);
  if ((long)local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    puVar14 = (uint *)operator_new__((ulong)((long)local_288.
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_288.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 1 &
                                     0x3fffffffc);
    local_260->mMeshes = puVar14;
    for (; puVar17 != puVar5; puVar17 = puVar17 + 1) {
      *puVar14 = (uint)*puVar17;
      puVar14 = puVar14 + 1;
    }
  }
  if (local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ColladaLoader::BuildMeshesForNode(const ColladaParser& pParser, const Collada::Node* pNode, aiNode* pTarget) {
    // accumulated mesh references by this node
    std::vector<size_t> newMeshRefs;
    newMeshRefs.reserve(pNode->mMeshes.size());

    // add a mesh for each subgroup in each collada mesh
    for (const Collada::MeshInstance& mid : pNode->mMeshes) {
        const Collada::Mesh* srcMesh = nullptr;
        const Collada::Controller* srcController = nullptr;

        // find the referred mesh
        ColladaParser::MeshLibrary::const_iterator srcMeshIt = pParser.mMeshLibrary.find(mid.mMeshOrController);
        if (srcMeshIt == pParser.mMeshLibrary.end()) {
            // if not found in the mesh-library, it might also be a controller referring to a mesh
            ColladaParser::ControllerLibrary::const_iterator srcContrIt = pParser.mControllerLibrary.find(mid.mMeshOrController);
            if (srcContrIt != pParser.mControllerLibrary.end()) {
                srcController = &srcContrIt->second;
                srcMeshIt = pParser.mMeshLibrary.find(srcController->mMeshId);
                if (srcMeshIt != pParser.mMeshLibrary.end()) {
                    srcMesh = srcMeshIt->second;
                }
            }


            if( nullptr == srcMesh) {
                ASSIMP_LOG_WARN_F( "Collada: Unable to find geometry for ID \"", mid.mMeshOrController, "\". Skipping." );
                continue;
            }
        }
        else {
            // ID found in the mesh library -> direct reference to an unskinned mesh
            srcMesh = srcMeshIt->second;
        }

        // build a mesh for each of its subgroups
        size_t vertexStart = 0, faceStart = 0;
        for (size_t sm = 0; sm < srcMesh->mSubMeshes.size(); ++sm) {
            const Collada::SubMesh& submesh = srcMesh->mSubMeshes[sm];
            if (submesh.mNumFaces == 0) {
                continue;
            }

            // find material assigned to this submesh
            std::string meshMaterial;
            std::map<std::string, Collada::SemanticMappingTable >::const_iterator meshMatIt = mid.mMaterials.find(submesh.mMaterial);

            const Collada::SemanticMappingTable* table = nullptr;
            if (meshMatIt != mid.mMaterials.end()) {
                table = &meshMatIt->second;
                meshMaterial = table->mMatName;
            }
            else {
                ASSIMP_LOG_WARN_F("Collada: No material specified for subgroup <", submesh.mMaterial, "> in geometry <",
                    mid.mMeshOrController, ">.");
                if (!mid.mMaterials.empty()) {
                    meshMaterial = mid.mMaterials.begin()->second.mMatName;
                }
            }

            // OK ... here the *real* fun starts ... we have the vertex-input-to-effect-semantic-table
            // given. The only mapping stuff which we do actually support is the UV channel.
            std::map<std::string, size_t>::const_iterator matIt = mMaterialIndexByName.find(meshMaterial);
            unsigned int matIdx = 0;
            if (matIt != mMaterialIndexByName.end()) {
                matIdx = static_cast<unsigned int>(matIt->second);
            }

            if (table && !table->mMap.empty()) {
                std::pair<Collada::Effect*, aiMaterial*>&  mat = newMats[matIdx];

                // Iterate through all texture channels assigned to the effect and
                // check whether we have mapping information for it.
                ApplyVertexToEffectSemanticMapping(mat.first->mTexDiffuse, *table);
                ApplyVertexToEffectSemanticMapping(mat.first->mTexAmbient, *table);
                ApplyVertexToEffectSemanticMapping(mat.first->mTexSpecular, *table);
                ApplyVertexToEffectSemanticMapping(mat.first->mTexEmissive, *table);
                ApplyVertexToEffectSemanticMapping(mat.first->mTexTransparent, *table);
                ApplyVertexToEffectSemanticMapping(mat.first->mTexBump, *table);
            }

            // built lookup index of the Mesh-Submesh-Material combination
            ColladaMeshIndex index(mid.mMeshOrController, sm, meshMaterial);

            // if we already have the mesh at the library, just add its index to the node's array
            std::map<ColladaMeshIndex, size_t>::const_iterator dstMeshIt = mMeshIndexByID.find(index);
            if (dstMeshIt != mMeshIndexByID.end()) {
                newMeshRefs.push_back(dstMeshIt->second);
            }
            else {
                // else we have to add the mesh to the collection and store its newly assigned index at the node
                aiMesh* dstMesh = CreateMesh(pParser, srcMesh, submesh, srcController, vertexStart, faceStart);

                // store the mesh, and store its new index in the node
                newMeshRefs.push_back(mMeshes.size());
                mMeshIndexByID[index] = mMeshes.size();
                mMeshes.push_back(dstMesh);
                vertexStart += dstMesh->mNumVertices; faceStart += submesh.mNumFaces;

                // assign the material index
                dstMesh->mMaterialIndex = matIdx;
                if (dstMesh->mName.length == 0) {
                    dstMesh->mName = mid.mMeshOrController;
                }
            }
        }
    }

    // now place all mesh references we gathered in the target node
    pTarget->mNumMeshes = static_cast<unsigned int>(newMeshRefs.size());
    if (newMeshRefs.size()) {
        struct UIntTypeConverter {
            unsigned int operator()(const size_t& v) const {
                return static_cast<unsigned int>(v);
            }
        };

        pTarget->mMeshes = new unsigned int[pTarget->mNumMeshes];
        std::transform(newMeshRefs.begin(), newMeshRefs.end(), pTarget->mMeshes, UIntTypeConverter());
    }
}